

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<char[10],int,char[17],unsigned_long,char[3],unsigned_long,char[3]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [10],
                   int *args_1,char (*args_2) [17],unsigned_long *args_3,char (*args_4) [3],
                   unsigned_long *args_5,char (*args_6) [3])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_150;
  cmAlphaNum local_120;
  cmAlphaNum local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  size_t local_b0;
  char *pcStack_a8;
  size_t local_a0;
  char (*local_98) [10];
  size_t local_90;
  char *pcStack_88;
  size_t local_80;
  char (*local_78) [17];
  size_t local_70;
  char *pcStack_68;
  size_t local_60;
  char (*local_58) [3];
  size_t local_50;
  char *pcStack_48;
  size_t local_40;
  char (*local_38) [3];
  
  local_c0._M_len = (a->View_)._M_len;
  local_c0._M_str = (a->View_)._M_str;
  local_b0 = (b->View_)._M_len;
  pcStack_a8 = (b->View_)._M_str;
  local_a0 = strlen(*args);
  local_98 = args;
  cmAlphaNum::cmAlphaNum(&local_f0,*args_1);
  local_90 = local_f0.View_._M_len;
  pcStack_88 = local_f0.View_._M_str;
  local_80 = strlen(*args_2);
  local_78 = args_2;
  cmAlphaNum::cmAlphaNum(&local_120,*args_3);
  local_70 = local_120.View_._M_len;
  pcStack_68 = local_120.View_._M_str;
  local_60 = strlen(*args_4);
  local_58 = args_4;
  cmAlphaNum::cmAlphaNum(&local_150,*args_5);
  local_50 = local_150.View_._M_len;
  pcStack_48 = local_150.View_._M_str;
  local_40 = strlen(*args_6);
  local_38 = args_6;
  views._M_len = 9;
  views._M_array = &local_c0;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}